

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Type.cpp
# Opt level: O0

Type * slang::ast::Type::getPredefinedType(Compilation *compilation,SyntaxKind kind,bool isSigned)

{
  Compilation *this;
  Type *this_00;
  ScalarType *pSVar1;
  PredefinedIntegerType *pPVar2;
  IntegralType *predef;
  bool isSigned_local;
  Compilation *pCStack_18;
  SyntaxKind kind_local;
  Compilation *compilation_local;
  
  predef._3_1_ = isSigned;
  predef._4_4_ = kind;
  pCStack_18 = compilation;
  this_00 = Compilation::getType(compilation,kind);
  compilation_local = (Compilation *)Symbol::as<slang::ast::IntegralType>(&this_00->super_Symbol);
  this = pCStack_18;
  if ((predef._3_1_ & 1) !=
      (*(byte *)((long)&(compilation_local->options).topModules.
                        super_sherwood_v3_table<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>,_slang::Hasher<std::basic_string_view<char,_std::char_traits<char>_>_>,_ska::detailv3::functor_storage<unsigned_long,_slang::Hasher<std::basic_string_view<char,_std::char_traits<char>_>_>_>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_ska::detailv3::functor_storage<bool,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<ska::detailv3::sherwood_v3_entry<std::basic_string_view<char,_std::char_traits<char>_>_>_>_>
                        .num_slots_minus_one + 4) & 1)) {
    if ((((Type *)&compilation_local->super_BumpAllocator)->super_Symbol).kind == ScalarType) {
      pSVar1 = Symbol::as<slang::ast::ScalarType>((Symbol *)compilation_local);
      compilation_local =
           (Compilation *)
           BumpAllocator::emplace<slang::ast::ScalarType,slang::ast::ScalarType::Kind_const&,bool&>
                     (&this->super_BumpAllocator,&pSVar1->scalarKind,(bool *)((long)&predef + 3));
    }
    else {
      pPVar2 = Symbol::as<slang::ast::PredefinedIntegerType>((Symbol *)compilation_local);
      compilation_local =
           (Compilation *)
           BumpAllocator::
           emplace<slang::ast::PredefinedIntegerType,slang::ast::PredefinedIntegerType::Kind_const&,bool&>
                     (&this->super_BumpAllocator,&pPVar2->integerKind,(bool *)((long)&predef + 3));
    }
  }
  return (Type *)compilation_local;
}

Assistant:

const Type& Type::getPredefinedType(Compilation& compilation, SyntaxKind kind, bool isSigned) {
    auto& predef = compilation.getType(kind).as<IntegralType>();
    if (isSigned == predef.isSigned)
        return predef;

    if (predef.kind == SymbolKind::ScalarType)
        return *compilation.emplace<ScalarType>(predef.as<ScalarType>().scalarKind, isSigned);

    return *compilation.emplace<PredefinedIntegerType>(
        predef.as<PredefinedIntegerType>().integerKind, isSigned);
}